

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O3

int Cec_GiaSplitTest2(Gia_Man_t *p,int nProcs,int nTimeOut,int nIterMax,int LookAhead,int fVerbose,
                     int fVeryVerbose,int fSilent)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Aig_Man_t *pAVar7;
  Cnf_Dat_t *pCVar8;
  undefined4 *__ptr;
  undefined8 *puVar9;
  Gia_Man_t *pGVar10;
  Gia_Man_t *pGVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  void *pvVar14;
  uint uVar15;
  int iVar16;
  char *__s;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  int nSatConfs;
  timespec ts;
  int Cost;
  int nFanouts;
  int local_a8;
  int local_a4;
  int local_a0;
  uint local_9c;
  int local_98;
  int local_94;
  timespec local_90;
  undefined4 *local_80;
  ulong local_78;
  double local_70;
  long local_68;
  Gia_Man_t *local_60;
  ulong local_58;
  int local_50;
  int local_4c;
  uint local_48;
  uint local_44;
  void *local_40;
  ulong local_38;
  
  local_98 = nTimeOut;
  local_94 = fVerbose;
  local_60 = p;
  local_50 = nIterMax;
  local_4c = LookAhead;
  iVar2 = clock_gettime(3,&local_90);
  pGVar10 = local_60;
  if (iVar2 < 0) {
    local_68 = -1;
  }
  else {
    local_68 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
  }
  pAVar7 = Gia_ManToAigSimple(local_60);
  pAVar7->nRegs = 0;
  pCVar8 = Cnf_Derive(pAVar7,0);
  Aig_ManStop(pAVar7);
  iVar3 = Cnf_GiaSolveOne(pGVar10,pCVar8,local_98,&local_a0,&local_a4);
  Cnf_DataFree(pCVar8);
  iVar16 = local_a0;
  iVar2 = local_a4;
  if (local_94 != 0) {
    iVar4 = clock_gettime(3,&local_90);
    if (iVar4 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
    }
    Cec_GiaSplitPrint(0,0,iVar16,iVar2,iVar3,0.0,lVar17 - local_68);
  }
  if (iVar3 == -1) {
    __ptr = (undefined4 *)malloc(0x10);
    *__ptr = 1000;
    puVar9 = (undefined8 *)malloc(8000);
    *(undefined8 **)(__ptr + 2) = puVar9;
    pGVar10 = Gia_ManDup(local_60);
    __ptr[1] = 1;
    *puVar9 = pGVar10;
    local_70 = 0.0;
    uVar5 = 1;
    local_78 = 1000;
    uVar20 = 1;
    local_80 = __ptr;
    do {
      local_40 = *(void **)(__ptr + 2);
      uVar19 = (ulong)((int)uVar20 - 1);
      pGVar10 = *(Gia_Man_t **)((long)local_40 + uVar19 * 8);
      local_a8 = 1;
      if (pGVar10->vCofVars != (Vec_Int_t *)0x0) {
        local_a8 = pGVar10->vCofVars->nSize + 1;
      }
      local_9c = uVar5;
      uVar5 = Gia_SplitCofVar(pGVar10,local_4c,(int *)&local_44,(int *)&local_48);
      pGVar11 = Gia_ManDupCofactorVar(pGVar10,uVar5,0);
      pVVar12 = pGVar10->vCofVars;
      if (pVVar12 == (Vec_Int_t *)0x0) {
        pVVar12 = (Vec_Int_t *)malloc(0x10);
        pVVar12->nCap = 100;
        pVVar12->nSize = 0;
        piVar13 = (int *)malloc(400);
        pVVar12->pArray = piVar13;
        pGVar10->vCofVars = pVVar12;
      }
      local_58 = uVar20;
      if (fVeryVerbose != 0) {
        printf("Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n",
               (ulong)uVar5,(ulong)local_44,(ulong)local_48,
               (ulong)(uint)(~(pGVar10->vCos->nSize + pGVar10->vCis->nSize) + pGVar10->nObjs),
               (ulong)(uint)(~(pGVar11->vCos->nSize + pGVar11->vCis->nSize) + pGVar11->nObjs));
        pVVar12 = pGVar10->vCofVars;
      }
      uVar18 = pVVar12->nSize;
      iVar2 = uVar18 + 1;
      pVVar12 = (Vec_Int_t *)malloc(0x10);
      if (uVar18 < 0xf) {
        iVar2 = 0x10;
      }
      pVVar12->nSize = 0;
      pVVar12->nCap = iVar2;
      if (iVar2 == 0) {
        piVar13 = (int *)0x0;
      }
      else {
        piVar13 = (int *)malloc((long)iVar2 << 2);
      }
      pVVar12->pArray = piVar13;
      pGVar11->vCofVars = pVVar12;
      pVVar1 = pGVar10->vCofVars;
      local_38 = uVar19;
      if (0 < pVVar1->nSize) {
        lVar17 = 0;
        do {
          Vec_IntPush(pVVar12,pVVar1->pArray[lVar17]);
          lVar17 = lVar17 + 1;
        } while (lVar17 < pVVar1->nSize);
        pVVar12 = pGVar11->vCofVars;
      }
      Vec_IntPush(pVVar12,uVar5 * 2 + 1);
      pAVar7 = Gia_ManToAigSimple(pGVar11);
      pAVar7->nRegs = 0;
      pCVar8 = Cnf_Derive(pAVar7,0);
      Aig_ManStop(pAVar7);
      iVar2 = Cnf_GiaSolveOne(pGVar11,pCVar8,local_98,&local_a0,&local_a4);
      Cnf_DataFree(pCVar8);
      if (iVar2 == 1) {
        dVar21 = ldexp(1.0,local_a8);
        local_70 = local_70 + 1.0 / dVar21;
      }
      iVar3 = local_a0;
      iVar16 = local_a4;
      if (local_94 != 0) {
        iVar4 = clock_gettime(3,&local_90);
        if (iVar4 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
        }
        Cec_GiaSplitPrint(local_9c,local_a8,iVar3,iVar16,iVar2,local_70,lVar17 - local_68);
      }
      uVar20 = local_38;
      __ptr = local_80;
      uVar18 = (uint)local_38;
      if (iVar2 == 0) {
        local_80[1] = uVar18;
        local_60->pCexComb = pGVar11->pCexComb;
        pGVar11->pCexComb = (Abc_Cex_t *)0x0;
        Gia_ManStop(pGVar10);
        Gia_ManStop(pGVar11);
        uVar6 = 0;
        uVar5 = local_9c;
LAB_005db21c:
        pvVar14 = *(void **)(__ptr + 2);
        uVar15 = 1;
        if (uVar18 != 0) {
          uVar15 = uVar6;
        }
        if (0 < (int)uVar18) {
          uVar20 = 0;
          do {
            Gia_ManStop(*(Gia_Man_t **)((long)pvVar14 + uVar20 * 8));
            uVar20 = uVar20 + 1;
          } while (uVar18 != uVar20);
          goto LAB_005db24b;
        }
        goto LAB_005db246;
      }
      if (iVar2 == 1) {
        Gia_ManStop(pGVar11);
        local_58 = uVar20 & 0xffffffff;
      }
      else {
        pvVar14 = local_40;
        if (uVar18 == (uint)local_78) {
          if ((uint)local_58 < 0x11) {
            if (local_40 == (void *)0x0) {
              pvVar14 = malloc(0x80);
            }
            else {
              pvVar14 = realloc(local_40,0x80);
            }
            uVar20 = 0x10;
          }
          else {
            uVar20 = (ulong)((uint)local_78 * 2);
            if (local_40 == (void *)0x0) {
              pvVar14 = malloc(uVar20 * 8);
            }
            else {
              pvVar14 = realloc(local_40,uVar20 * 8);
            }
          }
          *(void **)(local_80 + 2) = pvVar14;
          *local_80 = (int)uVar20;
          local_78 = uVar20;
        }
        *(Gia_Man_t **)((long)pvVar14 + (long)(int)uVar18 * 8) = pGVar11;
      }
      pGVar11 = Gia_ManDupCofactorVar(pGVar10,uVar5,1);
      uVar18 = pGVar10->vCofVars->nSize;
      iVar2 = uVar18 + 1;
      pVVar12 = (Vec_Int_t *)malloc(0x10);
      if (uVar18 < 0xf) {
        iVar2 = 0x10;
      }
      pVVar12->nSize = 0;
      pVVar12->nCap = iVar2;
      if (iVar2 == 0) {
        piVar13 = (int *)0x0;
      }
      else {
        piVar13 = (int *)malloc((long)iVar2 << 2);
      }
      pVVar12->pArray = piVar13;
      pGVar11->vCofVars = pVVar12;
      pVVar1 = pGVar10->vCofVars;
      if (0 < pVVar1->nSize) {
        lVar17 = 0;
        do {
          Vec_IntPush(pVVar12,pVVar1->pArray[lVar17]);
          lVar17 = lVar17 + 1;
        } while (lVar17 < pVVar1->nSize);
        pVVar12 = pGVar11->vCofVars;
      }
      Vec_IntPush(pVVar12,uVar5 * 2);
      Gia_ManStop(pGVar10);
      pAVar7 = Gia_ManToAigSimple(pGVar11);
      pAVar7->nRegs = 0;
      pCVar8 = Cnf_Derive(pAVar7,0);
      Aig_ManStop(pAVar7);
      iVar2 = Cnf_GiaSolveOne(pGVar11,pCVar8,local_98,&local_a0,&local_a4);
      Cnf_DataFree(pCVar8);
      if (iVar2 == 1) {
        dVar21 = ldexp(1.0,local_a8);
        local_70 = local_70 + 1.0 / dVar21;
      }
      uVar5 = local_9c;
      iVar3 = local_a0;
      iVar16 = local_a4;
      if (local_94 != 0) {
        iVar4 = clock_gettime(3,&local_90);
        if (iVar4 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
        }
        Cec_GiaSplitPrint(uVar5,local_a8,iVar3,iVar16,iVar2,local_70,lVar17 - local_68);
      }
      uVar20 = local_58;
      __ptr = local_80;
      iVar16 = (int)local_58;
      if (iVar2 == 0) {
        local_80[1] = iVar16;
        local_60->pCexComb = pGVar11->pCexComb;
        pGVar11->pCexComb = (Abc_Cex_t *)0x0;
        Gia_ManStop(pGVar11);
        uVar6 = 0;
LAB_005db219:
        uVar18 = (uint)uVar20;
        goto LAB_005db21c;
      }
      if (iVar2 == 1) {
        Gia_ManStop(pGVar11);
        __ptr = local_80;
      }
      else {
        iVar2 = (int)local_78;
        if (iVar16 == iVar2) {
          if (iVar2 < 0x10) {
            if (*(void **)(local_80 + 2) == (void *)0x0) {
              pvVar14 = malloc(0x80);
            }
            else {
              pvVar14 = realloc(*(void **)(local_80 + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar14;
            *__ptr = 0x10;
            local_78 = 0x10;
          }
          else {
            local_78 = (ulong)(uint)(iVar2 * 2);
            if (*(void **)(local_80 + 2) == (void *)0x0) {
              pvVar14 = malloc(local_78 * 8);
            }
            else {
              pvVar14 = realloc(*(void **)(local_80 + 2),local_78 * 8);
            }
            *(void **)(__ptr + 2) = pvVar14;
            *__ptr = (int)local_78;
          }
        }
        else {
          pvVar14 = *(void **)(local_80 + 2);
        }
        uVar20 = (ulong)(iVar16 + 1);
        *(Gia_Man_t **)((long)pvVar14 + (long)iVar16 * 8) = pGVar11;
      }
      iVar2 = (int)uVar20;
      if (local_50 <= (int)uVar5 && local_50 != 0) {
        __ptr[1] = iVar2;
        uVar6 = 0xffffffff;
        goto LAB_005db219;
      }
      uVar5 = uVar5 + 1;
    } while (0 < iVar2);
    __ptr[1] = iVar2;
    uVar15 = -(uint)(iVar2 != 0) | 1;
    pvVar14 = *(void **)(__ptr + 2);
LAB_005db246:
    if (pvVar14 != (void *)0x0) {
LAB_005db24b:
      free(pvVar14);
    }
    free(__ptr);
    if (fSilent == 0) {
      printf((&PTR_anon_var_dwarf_635fc4_00a9eca0)[(int)uVar15]);
      printf("after %d case-splits.  ",(ulong)uVar5);
      iVar16 = 3;
      iVar2 = clock_gettime(3,&local_90);
      if (iVar2 < 0) {
        lVar17 = -1;
      }
      else {
        lVar17 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
      }
      lVar17 = lVar17 - local_68;
      Abc_Print(iVar16,"%s =","Time");
      Abc_Print(iVar16,"%9.2f sec\n",(double)lVar17 / 1000000.0);
      fflush(_stdout);
    }
  }
  else {
    if (iVar3 == 1) {
      uVar15 = 1;
      if (fSilent != 0) {
        return 1;
      }
      __s = "The problem is UNSAT without cofactoring.";
    }
    else {
      uVar15 = 0;
      if (fSilent != 0) {
        return 0;
      }
      __s = "The problem is SAT without cofactoring.";
    }
    puts(__s);
  }
  return uVar15;
}

Assistant:

int Cec_GiaSplitTest2( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent )
{
    abctime clkTotal = Abc_Clock();
    Vec_Ptr_t * vStack;
    Cnf_Dat_t * pCnf;
    int nSatVars, nSatConfs;
    int nIter, status, RetValue = -1;
    double Progress = 0;
    // check the problem
    pCnf = Cec_GiaDeriveGiaRemapped( p );
    status = Cnf_GiaSolveOne( p, pCnf, nTimeOut, &nSatVars, &nSatConfs );
    Cnf_DataFree( pCnf );
    if ( fVerbose )
        Cec_GiaSplitPrint( 0, 0, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
    if ( status == 0 )
    {
		if ( !fSilent )
        printf( "The problem is SAT without cofactoring.\n" );
        return 0;
    }
    if ( status == 1 )
    {
		if ( !fSilent )
        printf( "The problem is UNSAT without cofactoring.\n" );
        return 1;
    }
    assert( status == -1 );
    // create local copy
    vStack = Vec_PtrAlloc( 1000 );
    Vec_PtrPush( vStack, Gia_ManDup(p) );
    // start with the current problem
    for ( nIter = 1; Vec_PtrSize(vStack) > 0; nIter++ )
    {
        // get the last AIG
        Gia_Man_t * pLast = (Gia_Man_t *)Vec_PtrPop( vStack );
        // determine cofactoring variable
        int Depth = 1 + (pLast->vCofVars ? Vec_IntSize(pLast->vCofVars) : 0);
        int nFanouts, Cost, iVar  = Gia_SplitCofVar( pLast, LookAhead, &nFanouts, &Cost );
        // cofactor
        Gia_Man_t * pPart = Gia_ManDupCofactorVar( pLast, iVar, 0 );
        if ( pLast->vCofVars == NULL )
            pLast->vCofVars = Vec_IntAlloc( 100 );
        // print results
        if ( fVeryVerbose )
        {
//            Cec_GiaSplitPrintRefs( pLast );
            printf( "Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n", 
                iVar, nFanouts, Cost, Gia_ManAndNum(pLast), Gia_ManAndNum(pPart) );
//            Cec_GiaSplitPrintRefs( pPart );
        }
        // create variable
        pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
        Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
        Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 1) );
        // solve the problem
        pCnf = Cec_GiaDeriveGiaRemapped( pPart );
        status = Cnf_GiaSolveOne( pPart, pCnf, nTimeOut, &nSatVars, &nSatConfs );
        Cnf_DataFree( pCnf );
        if ( status == 1 )
            Progress += 1.0 / pow(2, Depth);
        if ( fVerbose ) 
            Cec_GiaSplitPrint( nIter, Depth, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
        if ( status == 0 ) // SAT
        {
            p->pCexComb = pPart->pCexComb;  pPart->pCexComb = NULL;
            Gia_ManStop( pLast );
            Gia_ManStop( pPart );
            RetValue = 0;
            break;
        }
        if ( status == 1 ) // UNSAT
            Gia_ManStop( pPart );
        else               // UNDEC
            Vec_PtrPush( vStack, pPart );
        // cofactor
        pPart = Gia_ManDupCofactorVar( pLast, iVar, 1 );
        // create variable
        pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
        Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
        Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 0) );
        Gia_ManStop( pLast );
        // solve the problem
        pCnf = Cec_GiaDeriveGiaRemapped( pPart );
        status = Cnf_GiaSolveOne( pPart, pCnf, nTimeOut, &nSatVars, &nSatConfs );
        Cnf_DataFree( pCnf );
        if ( status == 1 )
            Progress += 1.0 / pow(2, Depth);
        if ( fVerbose )
            Cec_GiaSplitPrint( nIter, Depth, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
        if ( status == 0 ) // SAT
        {
            p->pCexComb = pPart->pCexComb;  pPart->pCexComb = NULL;
            Gia_ManStop( pPart );
            RetValue = 0;
            break;
        }
        if ( status == 1 ) // UNSAT
            Gia_ManStop( pPart );
        else               // UNDEC
            Vec_PtrPush( vStack, pPart );
        if ( nIterMax && nIter >= nIterMax )
            break;
    }
    if ( Vec_PtrSize(vStack) == 0 )
        RetValue = 1;
    // finish
    Cec_GiaSplitClean( vStack );
	if ( !fSilent )
	{
		if ( RetValue == 0 )
			printf( "Problem is SAT " );
		else if ( RetValue == 1 )
			printf( "Problem is UNSAT " );
		else if ( RetValue == -1 )
			printf( "Problem is UNDECIDED " );
		else assert( 0 );
		printf( "after %d case-splits.  ", nIter );
		Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
		fflush( stdout );
	}
    return RetValue;
}